

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void __thiscall Qentem::QTest::afterTest(QTest *this,bool test_for_leaks)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  wostream *pwVar6;
  char local_31;
  char *local_30;
  char *local_28;
  
  if (this->error_ == false) {
    local_28 = TestOutPut::GetColor(PASS);
    local_30 = TestOutPut::GetColor(END);
    local_31 = '\n';
    TestOutPut::Print<char_const*,char[5],char_const*,char[3],char_const*,char>
              (&local_28,(char (*) [5])"Pass",&local_30,(char (*) [3])0x10c3f6,&this->part_name_,
               &local_31);
  }
  if (test_for_leaks) {
    if (MemoryRecord::CheckSubMemory()::storage == '\0') {
      iVar2 = __cxa_guard_acquire(&MemoryRecord::CheckSubMemory()::storage);
      if (iVar2 != 0) {
        MemoryRecord::CheckSubMemory()::storage = MemoryRecord::getStorage()::data;
        __cxa_guard_release(&MemoryRecord::CheckSubMemory()::storage);
      }
    }
    iVar2 = *(int *)(MemoryRecord::CheckSubMemory()::storage + 8);
    iVar1 = *(int *)(MemoryRecord::CheckSubMemory()::storage + 0xc);
    if (MemoryRecord::ResetSubMemory()::storage == '\0') {
      iVar3 = __cxa_guard_acquire(&MemoryRecord::ResetSubMemory()::storage);
      if (iVar3 != 0) {
        MemoryRecord::ResetSubMemory()::storage = MemoryRecord::getStorage()::data;
        __cxa_guard_release(&MemoryRecord::ResetSubMemory()::storage);
      }
    }
    *(undefined8 *)(MemoryRecord::ResetSubMemory()::storage + 8) = 0;
    if (iVar2 != iVar1) {
      pcVar4 = TestOutPut::GetColor(ERROR);
      pcVar5 = TestOutPut::GetColor(END);
      if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
        pwVar6 = (wostream *)&std::wcout;
      }
      else {
        pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
      }
      pwVar6 = std::operator<<(pwVar6,pcVar4);
      pwVar6 = std::operator<<(pwVar6,"Leak detected");
      pwVar6 = std::operator<<(pwVar6,pcVar5);
      pwVar6 = std::operator<<(pwVar6,": ");
      pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
      std::operator<<(pwVar6," remaining allocations.\n");
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void afterTest(bool test_for_leaks) {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::PASS), "Pass",
                              TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        }

        if (test_for_leaks) {
            const SizeT remaining_allocations = MemoryRecord::CheckSubMemory();
            MemoryRecord::ResetSubMemory();

            if (remaining_allocations != 0) {
                TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Leak detected",
                                  TestOutPut::GetColor(TestOutPut::Colors::END), ": ", remaining_allocations,
                                  " remaining allocations.\n");
            }
        }
    }